

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execBitFieldDn<(moira::Core)2,(moira::Instr)138,(moira::Mode)0,4>
          (Moira *this,u16 opcode)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  u32 uVar4;
  u32 uVar5;
  u32 uVar6;
  uint uVar7;
  
  this->cp = 0;
  uVar4 = readI<(moira::Core)2,2>(this);
  if ((uVar4 >> 0xb & 1) == 0) {
    uVar6 = uVar4 >> 6 & 0x1f;
  }
  else {
    uVar6 = *(u32 *)((long)&(this->reg).field_3 + (ulong)(uVar4 >> 6 & 7) * 4);
  }
  uVar5 = uVar4;
  if ((uVar4 & 0x20) != 0) {
    uVar5 = *(u32 *)((long)&(this->reg).field_3 + (ulong)(uVar4 & 7) * 4);
  }
  uVar5 = (uVar5 - 1 & 0x1f) + 1;
  bVar3 = (byte)uVar6 & 0x1f;
  uVar7 = (uint)(0xffffffff00000000 >> (sbyte)uVar5);
  uVar1 = *(uint *)((long)&(this->reg).field_3 + (ulong)(opcode & 7) * 4);
  bVar2 = (byte)uVar6 & 0x1f;
  uVar6 = bitfield<(moira::Instr)138>
                    (this,uVar1 << bVar2 | uVar1 >> 0x20 - bVar2,uVar6,uVar5,
                     uVar7 >> bVar3 | uVar7 << 0x20 - bVar3);
  *(u32 *)((long)&(this->reg).field_3 + (ulong)(uVar4 >> 10 & 0x1c)) = uVar6;
  (*this->_vptr_Moira[2])(this,(ulong)(this->cp + 0x12));
  prefetch<(moira::Core)2,4ull>(this);
  return;
}

Assistant:

void
Moira::execBitFieldDn(u16 opcode)
{
    AVAILABILITY(Core::C68020)

    u16 ext = (u16)readI<C, Word>();

    int dy     = _____________xxx (opcode);
    int dn     = _xxx____________ (ext);
    int of     = _____xxxxx______ (ext);
    int doBit  = ____x___________ (ext);
    int wi     = ___________xxxxx (ext);
    int dwBit  = __________x_____ (ext);

    // If do or dw is set, offset or width are taken from data registers
    int rawOffset = doBit ? reg.d[of & 0b111] : of;
    int rawWidth = dwBit ? reg.d[wi & 0b111] : wi;

    // Crop offset and map width to 32, 1 ... 31
    int offset = rawOffset & 0b11111;
    int width = ((rawWidth - 1) & 0b11111) + 1;

    // Create the bit mask
    u32 mask = std::rotr(u32(0xFFFFFFFF00000000 >> width), offset);

    u32 data = readD(dy);
    u32 result, insert;

    switch (I) {

        case Instr::BFCHG:
        case Instr::BFCLR:
        case Instr::BFSET:

            result = bitfield<I>(data, offset, width, mask);
            writeD(dy, result);

            //           00  10  20        00  10  20        00  10  20
            //           .b  .b  .b        .w  .w  .w        .l  .l  .l
            CYCLES_DN   ( 0,  0,  0,        0,  0,  0,        0,  0, 12)
            break;

        case Instr::BFEXTS:
        case Instr::BFEXTU:

            data = std::rotl(data, offset);
            result = bitfield<I>(data, offset, width, mask);
            writeD(dn, result);

            //           00  10  20        00  10  20        00  10  20
            //           .b  .b  .b        .w  .w  .w        .l  .l  .l
            CYCLES_DN   ( 0,  0,  0,        0,  0,  0,        0,  0,  8)
            break;

        case Instr::BFFFO:
        {
            data = std::rotl(data, offset);
            result = bitfield<I>(data, rawOffset, width, mask);
            writeD(dn, result);

            //           00  10  20        00  10  20        00  10  20
            //           .b  .b  .b        .w  .w  .w        .l  .l  .l
            CYCLES_DN   ( 0,  0,  0,        0,  0,  0,        0,  0, 18)
            break;
        }
        case Instr::BFINS:

            insert = readD(dn);
            insert = u32(insert << (32 - width));

            reg.sr.n = NBIT<S>(insert);
            reg.sr.z = ZERO<S>(insert);
            reg.sr.v = 0;
            reg.sr.c = 0;

            insert = std::rotr((u32)insert, offset);
            writeD(dy, (data & ~mask) | insert);

            //           00  10  20        00  10  20        00  10  20
            //           .b  .b  .b        .w  .w  .w        .l  .l  .l
            CYCLES_DN   ( 0,  0,  0,        0,  0,  0,        0,  0, 10)
            break;

        case Instr::BFTST:

            (void)bitfield<I>(data, offset, width, mask);

            //           00  10  20        00  10  20        00  10  20
            //           .b  .b  .b        .w  .w  .w        .l  .l  .l
            CYCLES_DN   ( 0,  0,  0,        0,  0,  0,        0,  0,  6)
            break;

        default:
            fatalError;
    }

    prefetch<C, POLL>();

    FINALIZE
}